

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parents.h
# Opt level: O0

void __thiscall wasm::Parents::Parents(Parents *this,Expression *expr)

{
  Expression *local_18;
  Expression *expr_local;
  Parents *this_local;
  
  local_18 = expr;
  expr_local = (Expression *)this;
  Inner::Inner(&this->inner);
  Walker<wasm::Parents::Inner,_wasm::UnifiedExpressionVisitor<wasm::Parents::Inner,_void>_>::walk
            ((Walker<wasm::Parents::Inner,_wasm::UnifiedExpressionVisitor<wasm::Parents::Inner,_void>_>
              *)this,&local_18);
  return;
}

Assistant:

Parents(Expression* expr) { inner.walk(expr); }